

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

bool __thiscall capnp::anon_unknown_1::CapnpcCppMain::Slot::operator<(Slot *this,Slot other)

{
  Which whichType;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  whichType = this->whichType;
  if (((ulong)whichType < 0x13) && (other.whichType < (ANY_POINTER|BOOL))) {
    uVar3 = (&DAT_002204c0)[whichType];
    bVar5 = true;
    if ((uint)(&DAT_002204c0)[other._0_4_ & 0x1f] <= uVar3) {
      if (((uint)(&DAT_002204c0)[other._0_4_ & 0x1f] < uVar3) || (uVar3 == 0)) {
        bVar5 = false;
      }
      else if (uVar3 == 2) {
        bVar5 = this->offset < other.offset;
      }
      else {
        uVar1 = typeSizeBits(whichType);
        uVar4 = this->offset * uVar1;
        uVar2 = typeSizeBits(other.whichType);
        uVar3 = other.offset * uVar2;
        if (uVar3 <= uVar4) {
          bVar5 = uVar2 < uVar1 && uVar4 <= uVar3;
        }
      }
    }
    return bVar5;
  }
  kj::_::unreachable();
}

Assistant:

bool operator<(Slot other) const {
      // Sort by section, then start position, and finally size.

      auto section = sectionFor(whichType);
      auto otherSection = sectionFor(other.whichType);
      if (section < otherSection) {
        return true;
      } else if (section > otherSection) {
        return false;
      }

      switch (section) {
        case Section::NONE:
          return false;
        case Section::DATA: {
          auto bits = typeSizeBits(whichType);
          auto start = offset * bits;
          auto otherBits = typeSizeBits(other.whichType);
          auto otherStart = other.offset * otherBits;
          if (start < otherStart) {
            return true;
          } else if (start > otherStart) {
            return false;
          }

          // Sort larger sizes before smaller.
          return bits > otherBits;
        }
        case Section::POINTERS:
          return offset < other.offset;
      }
      KJ_UNREACHABLE;
    }